

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_solve(sat_solver *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,
                    ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  int iVar1;
  int iVar2;
  
  if (s->fSolved == 0) {
    if (s->fVerbose != 0) {
      printf("Running SAT solver with parameters %d and %d and %d.\n",(ulong)(uint)s->nLearntStart,
             (ulong)(uint)s->nLearntDelta,(ulong)(uint)s->nLearntRatio);
    }
    sat_solver_set_resource_limits(s,nConfLimit,nInsLimit,nConfLimitGlobal,nInsLimitGlobal);
    s->root_level = 0;
    iVar2 = 0;
    if (begin < end) {
      do {
        iVar2 = sat_solver_push(s,*begin);
        if (iVar2 == 0) {
          sat_solver_canceluntil(s,0);
          s->root_level = 0;
          return -1;
        }
        begin = begin + 1;
      } while (begin < end);
      iVar2 = s->root_level;
    }
    if (iVar2 != (s->trail_lim).size) {
      __assert_fail("s->root_level == sat_solver_dl(s)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x832,
                    "int sat_solver_solve(sat_solver *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
    iVar2 = sat_solver_solve_internal(s);
    sat_solver_canceluntil(s,0);
    s->root_level = 0;
    if (iVar2 == -1) {
      iVar2 = -1;
      if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
         (iVar1 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)0x0,(lit *)0x0), iVar1 == 0)) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x850,
                      "int sat_solver_solve(sat_solver *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                     );
      }
    }
  }
  else {
    iVar2 = -1;
    if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
       (iVar1 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)0x0,(lit *)0x0), iVar1 == 0)) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x81c,
                    "int sat_solver_solve(sat_solver *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
  }
  return iVar2;
}

Assistant:

int sat_solver_solve(sat_solver* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    lbool status;
    lit * i;
    ////////////////////////////////////////////////
    if ( s->fSolved )
    {
        if ( s->pStore )
        {
            int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, NULL, NULL );
            assert( RetValue );
            (void) RetValue;
        }
        return l_False;
    }
    ////////////////////////////////////////////////

    if ( s->fVerbose )
        printf( "Running SAT solver with parameters %d and %d and %d.\n", s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

    sat_solver_set_resource_limits( s, nConfLimit, nInsLimit, nConfLimitGlobal, nInsLimitGlobal );

#ifdef SAT_USE_ANALYZE_FINAL
    // Perform assumptions:
    s->root_level = 0;
    for ( i = begin; i < end; i++ )
        if ( !sat_solver_push(s, *i) )
        {
            sat_solver_canceluntil(s,0);
            s->root_level = 0;
            return l_False;
        }
    assert(s->root_level == sat_solver_dl(s));
#else
    //printf("solve: "); printlits(begin, end); printf("\n");
    for (i = begin; i < end; i++){
//        switch (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]){
        switch (var_value(s, *i)) {
        case var1: // l_True: 
            break;
        case varX: // l_Undef
            sat_solver_decision(s, *i);
            if (sat_solver_propagate(s) == 0)
                break;
            // fallthrough
        case var0: // l_False 
            sat_solver_canceluntil(s, 0);
            return l_False;
        }
    }
    s->root_level = sat_solver_dl(s);
#endif

    status = sat_solver_solve_internal(s);

    sat_solver_canceluntil(s,0);
    s->root_level = 0;

    ////////////////////////////////////////////////
    if ( status == l_False && s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, NULL, NULL );
        assert( RetValue );
        (void) RetValue;
    }
    ////////////////////////////////////////////////
    return status;
}